

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_9::DiskHandle::clone
          (DiskHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  void *pvVar2;
  Fault local_70;
  Fault f_1;
  SyscallResult local_58;
  undefined1 local_54 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  Fault local_40;
  Fault f;
  undefined1 auStack_30 [4];
  int error;
  DiskHandle *local_28;
  int local_20;
  int local_1c;
  int _kjSyscallError;
  int fd2;
  DiskHandle *this_local;
  OwnFd *result;
  
  _auStack_30 = &local_1c;
  local_28 = (DiskHandle *)__fn;
  __kjSyscallError = __fn;
  this_local = this;
  f.exception._4_4_ =
       kj::_::Debug::syscallError<kj::(anonymous_namespace)::DiskHandle::clone()const::_lambda()_1_>
                 ((anon_class_16_2_20c44c61 *)auStack_30,false);
  local_20 = f.exception._4_4_;
  if (f.exception._4_4_ == 0) {
    OwnFd::OwnFd(&this->fd,local_1c);
  }
  else {
    if ((f.exception._4_4_ != 0x16) && (f.exception._4_4_ != 0x5f)) {
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x124,f.exception._4_4_,"fnctl(fd, F_DUPFD_CLOEXEC, 3)","");
      kj::_::Debug::Fault::~Fault(&local_40);
    }
    _kjSyscallResult.errorNumber._3_1_ = 0;
    f_1.exception = (Exception *)local_54;
    local_58 = kj::_::Debug::
               syscall<kj::(anonymous_namespace)::DiskHandle::clone()const::_lambda()_2_>
                         ((anon_class_16_2_789bf438 *)&f_1,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_58);
    if (pvVar2 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_58);
      kj::_::Debug::Fault::Fault
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,299,iVar1,"_kj_fd = ::dup(fd)","");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    OwnFd::OwnFd(&this->fd,(int)local_54);
    iVar1 = OwnFd::operator_cast_to_int(&this->fd);
    setCloexec(iVar1);
  }
  return (int)this;
}

Assistant:

OwnFd clone() const {
#ifdef F_DUPFD_CLOEXEC
    int fd2;
    KJ_SYSCALL_HANDLE_ERRORS(fd2 = fcntl(fd, F_DUPFD_CLOEXEC, 3)) {
      case EINVAL:
      case EOPNOTSUPP:
        // fall back
        break;
      default:
        KJ_FAIL_SYSCALL("fnctl(fd, F_DUPFD_CLOEXEC, 3)", error) { break; }
        break;
    } else {
      return OwnFd(fd2);
    }
#endif

    auto result = KJ_SYSCALL_FD(::dup(fd));
    setCloexec(result);
    return result;
  }